

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

size_t phosg::skip_word(char *s,size_t offset)

{
  long lVar1;
  ulong uVar2;
  
  while ((uVar2 = (ulong)(byte)s[offset], 0x20 < uVar2 ||
         ((0x100002601U >> (uVar2 & 0x3f) & 1) == 0))) {
    offset = offset + 1;
  }
  if (*s != '\0') {
    while (((byte)uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
      lVar1 = offset + 1;
      offset = offset + 1;
      uVar2 = (ulong)(byte)s[lVar1];
    }
  }
  return offset;
}

Assistant:

size_t skip_word(const char* s, size_t offset) {
  return skip_whitespace(s, skip_non_whitespace(s, offset));
}